

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O2

void why_not_use_auto_pointer(void)

{
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> __p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  element_type *__tmp;
  allocator local_6d;
  allocator local_6c;
  allocator local_6b;
  allocator local_6a;
  allocator local_69;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pwin;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  films [5];
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)pbVar1,"The Iron Man",&local_69);
  pwin._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  films[0]._M_ptr = pbVar1;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)pbVar1,"The amazing four",&local_6a);
  local_50._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  films[1]._M_ptr = pbVar1;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)pbVar1,"Capital America",&local_6b);
  local_58._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  films[2]._M_ptr = pbVar1;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)pbVar1,"The spiderman",&local_6c);
  local_60._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  films[3]._M_ptr = pbVar1;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)pbVar1,"The superman",&local_6d);
  local_20._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  films[4]._M_ptr = pbVar1;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_20);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_60);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_58);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_50);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&pwin);
  __p = films[2];
  pwin._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  films[2]._M_ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&pwin,__p._M_ptr);
  std::operator<<((ostream *)&std::cout,"The mavel movies are:\n");
}

Assistant:

void why_not_use_auto_pointer() {
    using namespace std;

    auto_ptr<string> films[5] = {
            auto_ptr<string>(new string("The Iron Man")),
            auto_ptr<string>(new string("The amazing four")),
            auto_ptr<string>(new string("Capital America")),
            auto_ptr<string>(new string("The spiderman")),
            auto_ptr<string>(new string("The superman")),
    };

    //  when dispose, these two auto pointer will both try to free same memory on heap
    auto_ptr<string> pwin;
    pwin = films[2];  // film[2] lose owner ship， point to a null pointer

    std::cout << "The mavel movies are:\n";
    for (int i = 0; i < 5; i++) {
        std::cout << *films[i] << std::endl;
    }
    std::cout << "The winner is " << *pwin << "!\n";
//    cin.get();
}